

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_speakSync(OpenJTalk *oj,char *text)

{
  OpenJTalk *in_RSI;
  long in_RDI;
  OpenJTalk *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    openjtalk_stop((OpenJTalk *)0x19a2cf);
    synthesisU8(in_RSI,in_stack_ffffffffffffffe8);
    if (g_psd->length != 0) {
      speak_sync(in_stack_00000020);
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakSync(OpenJTalk *oj, const char *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisU8(oj, text);
	if (g_psd->length != 0)
	{
		speak_sync(oj);
	}
}